

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_rect nk_layout_widget_bounds(nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  float fVar4;
  float fVar5;
  nk_rect nVar6;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4cea,"struct nk_rect nk_layout_widget_bounds(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar3 = ctx->current->layout;
    if (pnVar3 != (nk_panel *)0x0) {
      fVar4 = pnVar3->at_x - (pnVar3->bounds).x;
      fVar5 = 0.0;
      if (0.0 <= fVar4) {
        fVar5 = fVar4;
      }
      nVar6.w = (pnVar3->bounds).w - fVar5;
      nVar6.h = (pnVar3->row).height;
      uVar1 = pnVar3->at_x;
      uVar2 = pnVar3->at_y;
      nVar6.y = (float)uVar2;
      nVar6.x = (float)uVar1;
      return nVar6;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4cec,"struct nk_rect nk_layout_widget_bounds(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4ceb,"struct nk_rect nk_layout_widget_bounds(struct nk_context *)");
}

Assistant:

NK_API struct nk_rect
nk_layout_widget_bounds(struct nk_context *ctx)
{
    struct nk_rect ret;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x = layout->at_x;
    ret.y = layout->at_y;
    ret.w = layout->bounds.w - NK_MAX(layout->at_x - layout->bounds.x,0);
    ret.h = layout->row.height;
    return ret;
}